

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

QString * QInputDialog::getItem
                    (QString *__return_storage_ptr__,QWidget *parent,QString *title,QString *label,
                    QStringList *items,int current,bool editable,bool *ok,WindowFlags flags,
                    InputMethodHints inputMethodHints)

{
  QString *pQVar1;
  long lVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  int iVar6;
  ulong uVar7;
  QWidget *this;
  Data *pDVar8;
  long in_FS_OFFSET;
  QAutoPointer<QInputDialog> local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (ulong)current;
  if (uVar7 < (ulong)(items->d).size) {
    pQVar1 = (items->d).ptr;
    local_58.d.d = pQVar1[uVar7].d.d;
    local_58.d.ptr = pQVar1[uVar7].d.ptr;
    local_58.d.size = pQVar1[uVar7].d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
  }
  this = (QWidget *)operator_new(0x28);
  QInputDialog((QInputDialog *)this,parent,flags);
  pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
  local_68.o.wp.d = pDVar8;
  local_68.o.wp.value = (QObject *)this;
  QWidget::setWindowTitle(this,title);
  setLabelText((QInputDialog *)this,label);
  setComboBoxItems((QInputDialog *)this,items);
  setTextValue((QInputDialog *)this,&local_58);
  setComboBoxEditable((QInputDialog *)this,editable);
  QWidget::setInputMethodHints(this,inputMethodHints);
  iVar6 = (**(code **)(*(long *)this + 0x1a8))(this);
  qVar5 = local_58.d.size;
  pcVar4 = local_58.d.ptr;
  pDVar3 = local_58.d.d;
  if (ok != (bool *)0x0) {
    *ok = iVar6 != 0;
  }
  if (iVar6 == 0 || *(int *)(pDVar8 + 4) == 0) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = pcVar4;
    local_58.d.size = 0;
    (__return_storage_ptr__->d).size = qVar5;
  }
  else {
    lVar2 = *(long *)&this->field_0x8;
    pDVar3 = *(Data **)(lVar2 + 0x338);
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar2 + 0x340);
    (__return_storage_ptr__->d).size = *(qsizetype *)(lVar2 + 0x348);
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QAutoPointer<QInputDialog>::~QAutoPointer(&local_68);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QInputDialog::getItem(QWidget *parent, const QString &title, const QString &label,
                              const QStringList &items, int current, bool editable, bool *ok,
                              Qt::WindowFlags flags, Qt::InputMethodHints inputMethodHints)
{
    QString text(items.value(current));

    QAutoPointer<QInputDialog> dialog(new QInputDialog(parent, flags));
    dialog->setWindowTitle(title);
    dialog->setLabelText(label);
    dialog->setComboBoxItems(items);
    dialog->setTextValue(text);
    dialog->setComboBoxEditable(editable);
    dialog->setInputMethodHints(inputMethodHints);

    const int ret = dialog->exec();
    if (ok)
        *ok = !!ret;
    if (bool(dialog) && ret) {
        return dialog->textValue();
    } else {
        return text;
    }
}